

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  bool bVar2;
  stbi_uc *psVar3;
  byte bVar4;
  stbi_uc sVar5;
  byte bVar6;
  stbi_uc sVar7;
  stbi_uc sVar8;
  stbi_uc sVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  bool bVar18;
  uint uVar19;
  int iVar20;
  stbi_uc *out;
  uint uVar21;
  uint c;
  uint *puVar22;
  uint uVar23;
  int iVar24;
  uint *puVar25;
  uchar *puVar26;
  uint y_00;
  uint uVar27;
  ulong __n;
  int iVar28;
  int z;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  uchar raw_data [4];
  uint local_7c;
  stbi_uc local_6c [4];
  uint *local_68;
  stbi_uc *local_60;
  uint *local_58;
  uint local_4c;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_68 = (uint *)y;
  local_58 = (uint *)x;
  local_4c = req_comp;
  bVar4 = stbi__get8(s);
  sVar5 = stbi__get8(s);
  bVar6 = stbi__get8(s);
  sVar7 = stbi__get8(s);
  sVar8 = stbi__get8(s);
  sVar9 = stbi__get8(s);
  local_60 = (stbi_uc *)CONCAT71(local_60._1_7_,sVar9);
  bVar10 = stbi__get8(s);
  bVar11 = stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  bVar12 = stbi__get8(s);
  bVar13 = stbi__get8(s);
  bVar14 = stbi__get8(s);
  bVar15 = stbi__get8(s);
  bVar16 = stbi__get8(s);
  bVar17 = stbi__get8(s);
  local_6c[0] = '\0';
  local_6c[1] = '\0';
  local_6c[2] = '\0';
  local_6c[3] = '\0';
  if (sVar5 == '\0') {
    if (0xf < bVar16) {
      bVar11 = bVar16;
      if ((bVar16 == 0x20) || (bVar16 == 0x18)) goto LAB_00163c2e;
      if (bVar16 != 0x10) goto LAB_00163c1f;
      uVar19 = bVar6 - 8;
      if (bVar6 < 8) {
        uVar19 = (uint)bVar6;
      }
      if (uVar19 != 3) goto LAB_00163bfb;
      bVar11 = 2;
      goto LAB_00163c31;
    }
    if (bVar16 == 8) goto LAB_00163c0d;
    if (bVar16 != 0xf) goto LAB_00163c1f;
LAB_00163bfb:
    bVar11 = 3;
    bVar2 = true;
    bVar31 = false;
  }
  else {
    uVar19 = (uint)bVar11;
    if (uVar19 < 0x18) {
      if (uVar19 - 0xf < 2) goto LAB_00163bfb;
      if (uVar19 != 8) goto LAB_00163c1f;
LAB_00163c0d:
      bVar31 = true;
      bVar2 = false;
      bVar11 = 1;
    }
    else {
      if ((uVar19 != 0x18) && (uVar19 != 0x20)) {
LAB_00163c1f:
        stbi__g_failure_reason = "bad format";
        return (void *)0x0;
      }
LAB_00163c2e:
      bVar11 = bVar11 >> 3;
LAB_00163c31:
      bVar31 = true;
      bVar2 = false;
    }
  }
  local_38 = (ulong)bVar12;
  uVar19 = (uint)bVar12 + (uint)bVar13 * 0x100;
  local_40 = (ulong)bVar14;
  local_48 = (ulong)bVar15 << 8;
  y_00 = (int)local_48 + (uint)bVar14;
  c = (uint)bVar11;
  *local_58 = uVar19;
  *local_68 = y_00;
  if (comp != (int *)0x0) {
    *comp = c;
  }
  iVar20 = stbi__mad3sizes_valid(uVar19,y_00,c,0);
  if (iVar20 == 0) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  local_68 = (uint *)stbi__malloc_mad3(uVar19,y_00,c,0);
  if (local_68 != (uint *)0x0) {
    stbi__skip(s,(uint)bVar4);
    puVar22 = local_68;
    if ((bVar6 < 8 && sVar5 == '\0') && !bVar2) {
      if (y_00 != 0) {
        iVar20 = (int)local_48 + (int)local_40;
        iVar28 = 0;
        do {
          iVar20 = iVar20 + -1;
          iVar24 = iVar28;
          if ((bVar17 >> 5 & 1) == 0) {
            iVar24 = iVar20;
          }
          stbi__getn(s,(stbi_uc *)((long)puVar22 + (long)(int)(iVar24 * uVar19 * c)),uVar19 * c);
          iVar28 = iVar28 + 1;
        } while (iVar20 != 0);
      }
    }
    else {
      bVar4 = (byte)local_60;
      uVar27 = (uint)bVar10 * 0x100 + (uint)(byte)local_60;
      if (sVar5 == '\0') {
        local_60 = (stbi_uc *)0x0;
        psVar3 = local_60;
      }
      else {
        stbi__skip(s,(uint)CONCAT11(sVar8,sVar7));
        out = (stbi_uc *)stbi__malloc_mad2(uVar27,c,0);
        if (out == (stbi_uc *)0x0) {
          free(local_68);
          goto LAB_00163e05;
        }
        psVar3 = out;
        if (bVar31) {
          iVar20 = stbi__getn(s,out,uVar27 * c);
          if (iVar20 == 0) {
            free(local_68);
            free(out);
            stbi__g_failure_reason = "bad palette";
            return (void *)0x0;
          }
        }
        else {
          if (c != 3) {
            __assert_fail("tga_comp == STBI_rgb",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                          ,0x1542,
                          "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                         );
          }
          if (uVar27 != 0) {
            uVar21 = (uint)CONCAT11(bVar10,bVar4);
            local_60 = out;
            do {
              stbi__tga_read_rgb16(s,out);
              out = out + 3;
              uVar21 = uVar21 - 1;
              psVar3 = local_60;
            } while (uVar21 != 0);
          }
        }
      }
      local_60 = psVar3;
      if (y_00 * uVar19 != 0) {
        __n = (ulong)c;
        local_58 = (uint *)(ulong)(y_00 * uVar19);
        bVar18 = true;
        puVar22 = (uint *)0x0;
        local_7c = 0;
        iVar20 = 0;
        do {
          if (bVar6 < 8) {
LAB_00163ed9:
            if (sVar5 == '\0') {
              if (!bVar31) {
                if (c != 3) {
                  __assert_fail("tga_comp == STBI_rgb",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                                ,0x1573,
                                "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                               );
                }
                stbi__tga_read_rgb16(s,local_6c);
                goto LAB_00163f95;
              }
              if (c != 0) {
                uVar29 = 0;
                do {
                  sVar7 = stbi__get8(s);
                  local_6c[uVar29] = sVar7;
                  uVar29 = uVar29 + 1;
                } while (__n != uVar29);
                goto LAB_00163f6c;
              }
            }
            else {
              bVar4 = stbi__get8(s);
              uVar21 = (uint)bVar4;
              if (bVar16 != 8) {
                sVar7 = stbi__get8(s);
                uVar21 = (uint)CONCAT11(sVar7,bVar4);
              }
              if (c != 0) {
                if (uVar27 <= uVar21) {
                  uVar21 = 0;
                }
                memcpy(local_6c,local_60 + uVar21 * c,__n);
LAB_00163f95:
                memcpy((uchar *)((long)local_68 + (ulong)(c * (int)puVar22)),local_6c,__n);
              }
            }
          }
          else {
            if (iVar20 == 0) {
              bVar4 = stbi__get8(s);
              iVar20 = (bVar4 & 0x7f) + 1;
              local_7c = (uint)(bVar4 >> 7);
              goto LAB_00163ed9;
            }
            bVar30 = local_7c != 0;
            local_7c = 1;
            if (!bVar30 || bVar18) {
              local_7c = (uint)bVar30;
              goto LAB_00163ed9;
            }
LAB_00163f6c:
            if (c != 0) goto LAB_00163f95;
          }
          iVar20 = iVar20 + -1;
          puVar22 = (uint *)((long)puVar22 + 1);
          bVar18 = false;
        } while (puVar22 != local_58);
      }
      puVar22 = local_68;
      if (y_00 != 0 && (bVar17 >> 5 & 1) == 0) {
        iVar20 = uVar19 * c;
        uVar21 = ((int)local_40 + (int)local_48) - 1;
        iVar28 = ((uint)bVar13 * 0x100 | (uint)local_38) * uVar21 * c;
        uVar23 = 0;
        uVar27 = 0;
        do {
          if (iVar20 != 0) {
            puVar25 = local_68;
            iVar24 = iVar20 + 1;
            do {
              uVar1 = *(uchar *)((long)puVar25 + (ulong)uVar23);
              *(uchar *)((long)puVar25 + (ulong)uVar23) = *(uchar *)((long)puVar25 + (long)iVar28);
              *(uchar *)((long)puVar25 + (long)iVar28) = uVar1;
              puVar25 = (uint *)((long)puVar25 + 1);
              iVar24 = iVar24 + -1;
            } while (1 < iVar24);
          }
          iVar28 = iVar28 - iVar20;
          uVar23 = uVar23 + iVar20;
          bVar31 = uVar27 != uVar21 >> 1;
          uVar27 = uVar27 + 1;
        } while (bVar31);
      }
      if (local_60 != (stbi_uc *)0x0) {
        free(local_60);
      }
    }
    if ((!bVar2 && 2 < bVar11) && (iVar20 = y_00 * uVar19, iVar20 != 0)) {
      puVar26 = (uchar *)((long)puVar22 + 2);
      do {
        uVar1 = puVar26[-2];
        puVar26[-2] = *puVar26;
        *puVar26 = uVar1;
        puVar26 = puVar26 + c;
        iVar20 = iVar20 + -1;
      } while (iVar20 != 0);
    }
    if (c != local_4c && local_4c != 0) {
      puVar26 = stbi__convert_format((uchar *)puVar22,c,local_4c,uVar19,y_00);
      return puVar26;
    }
    return (uchar *)puVar22;
  }
LAB_00163e05:
  stbi__g_failure_reason = "outofmem";
  return (void *)0x0;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   //   OK, done
   return tga_data;
}